

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::updateNoClear
          (CLUFactor<double> *this,int p_col,double *p_work,int *p_idx,int num)

{
  pointer pdVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  double dVar9;
  double dVar10;
  
  dVar9 = 1.0 / p_work[p_col];
  iVar4 = makeLvec(this,num,p_col);
  pdVar1 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->l).idx;
  lVar7 = (long)iVar4 << 0x20;
  uVar6 = num - 2;
  piVar8 = p_idx + num;
  lVar3 = (long)iVar4 * 4;
  while( true ) {
    lVar5 = lVar3 + 4;
    piVar8 = piVar8 + -1;
    iVar4 = *piVar8;
    if (iVar4 == p_col) break;
    *(int *)((long)piVar2 + lVar3) = iVar4;
    *(double *)((long)pdVar1 + lVar5 * 2 + -8) = p_work[iVar4] * dVar9;
    lVar7 = lVar7 + 0x100000000;
    uVar6 = uVar6 - 1;
    lVar3 = lVar5;
  }
  *(int *)((long)piVar2 + (lVar7 >> 0x1e)) = p_col;
  *(double *)((long)pdVar1 + (lVar7 >> 0x1d)) = 1.0 - dVar9;
  for (; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    iVar4 = p_idx[uVar6];
    *(int *)((long)piVar2 + lVar5) = iVar4;
    dVar10 = p_work[iVar4];
    *(double *)((long)pdVar1 + lVar5 * 2) = dVar10 * dVar9;
    dVar10 = ABS(dVar10 * dVar9);
    if (this->maxabs <= dVar10 && dVar10 != this->maxabs) {
      this->maxabs = dVar10;
    }
    lVar5 = lVar5 + 4;
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}